

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O2

void __thiscall cmCTestLaunch::cmCTestLaunch(cmCTestLaunch *this,int argc,char **argv)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  cmsysProcess *pcVar3;
  string local_50;
  
  (this->OptionOutput)._M_dataplus._M_p = (pointer)&(this->OptionOutput).field_2;
  (this->OptionOutput)._M_string_length = 0;
  (this->OptionOutput).field_2._M_local_buf[0] = '\0';
  (this->OptionSource)._M_dataplus._M_p = (pointer)&(this->OptionSource).field_2;
  (this->OptionSource)._M_string_length = 0;
  (this->OptionSource).field_2._M_local_buf[0] = '\0';
  (this->OptionLanguage)._M_dataplus._M_p = (pointer)&(this->OptionLanguage).field_2;
  (this->OptionLanguage)._M_string_length = 0;
  (this->OptionLanguage).field_2._M_local_buf[0] = '\0';
  (this->OptionTargetName)._M_dataplus._M_p = (pointer)&(this->OptionTargetName).field_2;
  (this->OptionTargetName)._M_string_length = 0;
  (this->OptionTargetName).field_2._M_local_buf[0] = '\0';
  (this->OptionTargetType)._M_dataplus._M_p = (pointer)&(this->OptionTargetType).field_2;
  (this->OptionTargetType)._M_string_length = 0;
  (this->OptionTargetType).field_2._M_local_buf[0] = '\0';
  (this->OptionBuildDir)._M_dataplus._M_p = (pointer)&(this->OptionBuildDir).field_2;
  (this->OptionBuildDir)._M_string_length = 0;
  (this->OptionBuildDir).field_2._M_local_buf[0] = '\0';
  (this->OptionFilterPrefix)._M_dataplus._M_p = (pointer)&(this->OptionFilterPrefix).field_2;
  (this->OptionFilterPrefix)._M_string_length = 0;
  (this->OptionFilterPrefix).field_2._M_local_buf[0] = '\0';
  (this->CWD)._M_dataplus._M_p = (pointer)&(this->CWD).field_2;
  (this->CWD)._M_string_length = 0;
  (this->CWD).field_2._M_local_buf[0] = '\0';
  (this->RealArgs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->RealArgs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->RealArgs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->LogHash)._M_dataplus._M_p = (pointer)&(this->LogHash).field_2;
  (this->LogHash)._M_string_length = 0;
  (this->LogHash).field_2._M_local_buf[0] = '\0';
  (this->LogDir)._M_dataplus._M_p = (pointer)&(this->LogDir).field_2;
  (this->LogDir)._M_string_length = 0;
  (this->LogDir).field_2._M_local_buf[0] = '\0';
  (this->LogOut)._M_dataplus._M_p = (pointer)&(this->LogOut).field_2;
  (this->LogOut)._M_string_length = 0;
  (this->LogOut).field_2._M_local_buf[0] = '\0';
  (this->LogErr)._M_dataplus._M_p = (pointer)&(this->LogErr).field_2;
  (this->LogErr)._M_string_length = 0;
  (this->LogErr).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->Labels)._M_t._M_impl.super__Rb_tree_header;
  (this->Labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Labels)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->Labels)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->RegexWarningSuppress).
  super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->RegexWarningSuppress).
  super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->RegexWarning).
  super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->RegexWarningSuppress).
  super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->RegexWarning).
  super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->RegexWarning).
  super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->SourceDir)._M_dataplus._M_p = (pointer)&(this->SourceDir).field_2;
  (this->SourceDir)._M_string_length = 0;
  (this->SourceDir).field_2._M_local_buf[0] = '\0';
  this->Passthru = true;
  this->Process = (cmsysProcess_s *)0x0;
  this->ExitCode = 1;
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
            (&local_50,(SystemTools *)0x1,SUB81(argv,0));
  std::__cxx11::string::operator=((string *)&this->CWD,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  bVar2 = ParseArguments(this,argc,argv);
  if (bVar2) {
    ComputeFileNames(this);
    this->ScrapeRulesLoaded = false;
    this->HaveOut = false;
    this->HaveErr = false;
    pcVar3 = cmsysProcess_New();
    this->Process = pcVar3;
  }
  return;
}

Assistant:

cmCTestLaunch::cmCTestLaunch(int argc, const char* const* argv)
{
  this->Passthru = true;
  this->Process = nullptr;
  this->ExitCode = 1;
  this->CWD = cmSystemTools::GetCurrentWorkingDirectory();

  if (!this->ParseArguments(argc, argv)) {
    return;
  }

  this->ComputeFileNames();

  this->ScrapeRulesLoaded = false;
  this->HaveOut = false;
  this->HaveErr = false;
  this->Process = cmsysProcess_New();
}